

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_123a4::FormatterTest_TestFormattersEnabled_Test::TestBody
          (FormatterTest_TestFormattersEnabled_Test *this)

{
  (anonymous_namespace)::
  check_enabled_formatters<char,bool,char,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,void*,void_const*,char*,char_const*,std::__cxx11::string>
            ();
  (anonymous_namespace)::
  check_enabled_formatters<wchar_t,bool,wchar_t,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,void*,void_const*,wchar_t*,wchar_t_const*,std::__cxx11::wstring>
            ();
  (anonymous_namespace)::check_enabled_formatters<char,decltype(nullptr)>();
  (anonymous_namespace)::check_enabled_formatters<wchar_t,decltype(nullptr)>();
  return;
}

Assistant:

TEST(FormatterTest, TestFormattersEnabled) {
  check_enabled_formatters<char,
      bool, char, signed char, unsigned char, short, unsigned short,
      int, unsigned, long, unsigned long, long long, unsigned long long,
      float, double, long double, void*, const void*,
      char*, const char*, std::string>();
  check_enabled_formatters<wchar_t,
      bool, wchar_t, signed char, unsigned char, short, unsigned short,
      int, unsigned, long, unsigned long, long long, unsigned long long,
      float, double, long double, void*, const void*,
      wchar_t*, const wchar_t*, std::wstring>();
#if FMT_USE_NULLPTR
  check_enabled_formatters<char, std::nullptr_t>();
  check_enabled_formatters<wchar_t, std::nullptr_t>();
#endif
}